

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::NameFinder::match(NameFinder *this,string *name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  StringTokenizer *in_RDX;
  SelectionSet *in_RDI;
  int internalIndex;
  int size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  StringTokenizer tokenizer;
  SelectionSet *bs;
  value_type *in_stack_fffffffffffffd28;
  errorStruct *in_stack_fffffffffffffd30;
  StringTokenizer *in_stack_fffffffffffffd38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  reference in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string *in_stack_fffffffffffffd68;
  errorStruct *peVar7;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd78;
  SelectionSet *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  NameFinder *in_stack_fffffffffffffd90;
  SelectionSet *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda4;
  int internalIndex_00;
  string *in_stack_fffffffffffffda8;
  NameFinder *in_stack_fffffffffffffdb0;
  SelectionSet *in_stack_fffffffffffffdc8;
  allocator<char> *bs_00;
  undefined4 in_stack_fffffffffffffdd4;
  StringTokenizer *this_00;
  NameFinder *this_01;
  allocator<char> local_1f1;
  SelectionSet *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  NameFinder *in_stack_fffffffffffffe30;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [8];
  string *in_stack_fffffffffffffee0;
  string local_100 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 local_c1 [168];
  byte local_19;
  StringTokenizer *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  SelectionSet::SelectionSet(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40);
  this_01 = (NameFinder *)local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (char *)in_stack_fffffffffffffd68,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68,
             (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string((string *)(local_c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3f5870);
  this_00 = local_18;
  while( true ) {
    bVar1 = StringTokenizer::hasMoreTokens(in_stack_fffffffffffffd38);
    in_stack_fffffffffffffdd4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd4);
    if (!bVar1) break;
    StringTokenizer::nextToken_abi_cxx11_(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_100);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_e0);
  iVar2 = (int)sVar3;
  if (iVar2 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchMolecule(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    bs_00 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchStuntDouble(this_01,&this_00->tokenString_,
                     (string *)CONCAT44(in_stack_fffffffffffffdd4,iVar2),(SelectionSet *)bs_00);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchBond(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
              (SelectionSet *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchBend(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
              (SelectionSet *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchTorsion(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (SelectionSet *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,0);
    matchInversion(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   (SelectionSet *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
  }
  else if (iVar2 == 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_e0,1);
    bVar1 = isInteger((NameFinder *)in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30);
    internalIndex_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffda4);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_e0,1);
      iVar2 = lexi_cast<int>(in_stack_fffffffffffffee0);
      if (iVar2 < 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_e0,0);
        uVar5 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_e0,1);
        uVar4 = std::__cxx11::string::c_str();
        peVar7 = &painCave;
        snprintf(painCave.errMsg,2000,"NameFinder : Name %s.%s is an invalid name.\n",uVar5,uVar4);
        peVar7->severity = 2;
        peVar7->isFatal = 0;
        simError();
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_e0,0);
        matchInternalIndex(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,internalIndex_00,
                           in_stack_fffffffffffffd98);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (char *)in_stack_fffffffffffffd68,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      pvVar6 = &local_e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar6,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar6,1);
      matchRigidAtoms(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
      std::allocator<char>::~allocator(&local_1f1);
      pvVar6 = &local_e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar6,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar6,1);
      matchStuntDouble(this_01,&this_00->tokenString_,
                       (string *)CONCAT44(in_stack_fffffffffffffdd4,iVar2),in_stack_fffffffffffffdc8
                      );
    }
  }
  else if (iVar2 == 3) {
    pvVar6 = &local_e0;
    in_stack_fffffffffffffd40 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](pvVar6,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](pvVar6,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](pvVar6,2);
    matchRigidAtoms(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  else {
    uVar5 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffd30 = &painCave;
    snprintf(painCave.errMsg,2000,"NameFinder : Invalid Name %s.\n",uVar5);
    in_stack_fffffffffffffd30->severity = 2;
    in_stack_fffffffffffffd30->isFatal = 0;
    simError();
  }
  local_19 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd40);
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffd30);
  if ((local_19 & 1) == 0) {
    SelectionSet::~SelectionSet((SelectionSet *)0x3f615c);
  }
  return in_RDI;
}

Assistant:

SelectionSet NameFinder::match(const std::string& name) {
    SelectionSet bs(nObjects_);

    StringTokenizer tokenizer(name, ".");

    std::vector<std::string> names;
    while (tokenizer.hasMoreTokens()) {
      names.push_back(tokenizer.nextToken());
    }

    int size = names.size();

    switch (size) {
    case 1:
      // could be molecule name, atom name and rigidbody name
      matchMolecule(names[0], bs);
      matchStuntDouble("*", names[0], bs);
      matchBond("*", names[0], bs);
      matchBend("*", names[0], bs);
      matchTorsion("*", names[0], bs);
      matchInversion("*", names[0], bs);

      break;
    case 2:
      // could be molecule.*(include atoms and rigidbodies) or rigidbody.*(atoms
      // belong to rigidbody)

      if (!isInteger(names[1])) {
        matchRigidAtoms("*", names[0], names[1], bs);
        matchStuntDouble(names[0], names[1], bs);
      } else {
        int internalIndex = lexi_cast<int>(names[1]);
        if (internalIndex < 0) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "NameFinder : Name %s.%s is an invalid name.\n",
                   names[0].c_str(), names[1].c_str());
          painCave.severity = OPENMD_WARNING;
          painCave.isFatal  = 0;
          simError();
        } else {
          matchInternalIndex(names[0], internalIndex, bs);
        }
      }

      break;
    case 3:
      // must be molecule.rigidbody.*
      matchRigidAtoms(names[0], names[1], names[2], bs);
      break;
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NameFinder : Invalid Name %s.\n", name.c_str());
      painCave.severity = OPENMD_WARNING;
      painCave.isFatal  = 0;
      simError();
      break;
    }
    return bs;
  }